

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestTemplateSearchPath(void)

{
  __type _Var1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Template *pTVar7;
  ulong uVar8;
  long lVar9;
  TemplateString local_788;
  TemplateString local_768;
  allocator local_741;
  string local_740 [32];
  Template local_720 [39];
  allocator local_6f9;
  string local_6f8 [32];
  Template local_6d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698 [39];
  allocator local_671;
  string local_670 [32];
  TemplateString local_650;
  Template *local_630;
  Template *b_foo;
  string local_620 [32];
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  string local_5b8 [32];
  undefined1 local_598 [8];
  TemplateCache cache2;
  allocator local_551;
  string local_550 [32];
  string local_530 [39];
  allocator local_509;
  string local_508 [32];
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [32];
  TemplateString local_4a0;
  Template *local_480;
  Template *a_foo;
  string local_470 [32];
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [8];
  string path_b_foo;
  allocator local_349;
  string local_348 [32];
  string local_328 [8];
  string path_a_foo;
  allocator local_301;
  string local_300 [32];
  TemplateString local_2e0;
  Template *local_2c0;
  Template *b_bar;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [8];
  string path_b_bar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  TemplateString local_178;
  TemplateDictionary local_158 [8];
  TemplateDictionary dict;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [8];
  string pathB;
  allocator local_89;
  string local_88 [32];
  string local_68 [8];
  string pathA;
  undefined1 local_48 [8];
  TemplateCache cache1;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"a/",&local_89);
  ctemplate::PathJoin(local_68,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"b/",&local_e1);
  ctemplate::PathJoin(local_c0,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  ctemplate::CreateOrCleanTestDir((string *)local_68);
  ctemplate::CreateOrCleanTestDir((string *)local_c0);
  ctemplate::TemplateString::TemplateString(&local_178,"");
  ctemplate::TemplateDictionary::TemplateDictionary(local_158,&local_178,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_48);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)local_48);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var1 = std::operator==(local_198,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
  std::__cxx11::string::~string((string *)local_198);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x110,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var1 = std::operator==(local_1b8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    if (!_Var1) {
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x110,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    std::__cxx11::string::~string((string *)local_1b8);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"template_bar",&local_1f9);
  ctemplate::PathJoin(local_1d8,local_c0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"b/template_bar",&local_221);
  ctemplate::StringToFile((string *)local_220,(string *)local_1d8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"template_bar",&local_269);
  ctemplate::TemplateCache::FindTemplateFilename(local_248);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar4 = strcmp(pcVar5,pcVar6);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  if (iVar4 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x116,
           "strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0")
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"template_bar",(allocator *)((long)&b_bar + 7));
    ctemplate::TemplateCache::FindTemplateFilename(local_290);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar4 = strcmp(pcVar5,pcVar6);
    if (iVar4 == 0) {
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&b_bar + 7));
      exit(1);
    }
    __assert_fail("strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x116,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  ctemplate::TemplateString::TemplateString(&local_2e0,"template_bar");
  pTVar7 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_2e0);
  local_2c0 = pTVar7;
  if (pTVar7 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x118,"b_bar");
    if (local_2c0 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("b_bar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x118,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"b/template_bar",&local_301);
  ctemplate::AssertExpandIs(pTVar7,local_158,(string *)local_300,true);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"template_foo",&local_349);
  ctemplate::PathJoin(local_328,local_68);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"template_foo",&local_391);
  ctemplate::PathJoin(local_370,local_c0);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"a/template_foo",&local_3b9);
  ctemplate::StringToFile((string *)local_3b8,(string *)local_328);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"b/template_foo",&local_3e1);
  ctemplate::StringToFile((string *)local_3e0,(string *)local_370);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"template_foo",&local_429);
  ctemplate::TemplateCache::FindTemplateFilename(local_408);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar4 = strcmp(pcVar5,pcVar6);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  if (iVar4 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x122,
           "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0")
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"template_foo",(allocator *)((long)&a_foo + 7));
    ctemplate::TemplateCache::FindTemplateFilename(local_450);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar4 = strcmp(pcVar5,pcVar6);
    if (iVar4 == 0) {
      std::__cxx11::string::~string(local_450);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)((long)&a_foo + 7));
      exit(1);
    }
    __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x122,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  ctemplate::TemplateString::TemplateString(&local_4a0,"template_foo");
  pTVar7 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_4a0);
  local_480 = pTVar7;
  if (pTVar7 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x124,"a_foo");
    if (local_480 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("a_foo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x124,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"a/template_foo",&local_4c1);
  ctemplate::AssertExpandIs(pTVar7,local_158,(string *)local_4c0,true);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"baz",&local_509);
  ctemplate::TemplateCache::FindTemplateFilename(local_4e8);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x129,"cache1.FindTemplateFilename(\"baz\").empty()");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"baz",&local_551);
    ctemplate::TemplateCache::FindTemplateFilename(local_530);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      __assert_fail("cache1.FindTemplateFilename(\"baz\").empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x129,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    exit(1);
  }
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_598);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_598);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"template_foo",&local_5d9);
  ctemplate::TemplateCache::FindTemplateFilename(local_5b8);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar4 = strcmp(pcVar5,pcVar6);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  if (iVar4 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x12f,
           "strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0")
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_620,"template_foo",(allocator *)((long)&b_foo + 7));
    ctemplate::TemplateCache::FindTemplateFilename(local_600);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar4 = strcmp(pcVar5,pcVar6);
    if (iVar4 == 0) {
      std::__cxx11::string::~string(local_600);
      std::__cxx11::string::~string(local_620);
      std::allocator<char>::~allocator((allocator<char> *)((long)&b_foo + 7));
      exit(1);
    }
    __assert_fail("strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x12f,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  ctemplate::TemplateString::TemplateString(&local_650,"template_foo");
  pTVar7 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)local_598,(Strip)&local_650);
  local_630 = pTVar7;
  if (pTVar7 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x131,"b_foo");
    if (local_630 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("b_foo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x131,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"b/template_foo",&local_671);
  ctemplate::AssertExpandIs(pTVar7,local_158,(string *)local_670,true);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  ctemplate::Template::template_root_directory_abi_cxx11_();
  bVar3 = std::operator==(local_698,(char *)&ctemplate::kCWD);
  std::__cxx11::string::~string((string *)local_698);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x135,"Template::template_root_directory() == kCWD");
    ctemplate::Template::template_root_directory_abi_cxx11_();
    bVar3 = std::operator==(local_6b8,(char *)&ctemplate::kCWD);
    if (!bVar3) {
      __assert_fail("Template::template_root_directory() == kCWD",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x135,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    std::__cxx11::string::~string((string *)local_6b8);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"template_foo",&local_6f9);
  ctemplate::Template::FindTemplateFilename(local_6d8,(string *)local_6f8);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    ctemplate::TemplateString::TemplateString(&local_768,"template_foo");
    lVar9 = ctemplate::Template::GetTemplate(&local_768,DO_NOT_STRIP);
    if (lVar9 == 0) {
      ctemplate::CreateOrCleanTestDir((string *)local_68);
      ctemplate::CreateOrCleanTestDir((string *)local_c0);
      ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_598);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_1d8);
      ctemplate::TemplateDictionary::~TemplateDictionary(local_158);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_68);
      ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x137,
           "!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_788,"template_foo");
    lVar9 = ctemplate::Template::GetTemplate(&local_788,DO_NOT_STRIP);
    if (lVar9 != 0) {
      __assert_fail("!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x137,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    exit(1);
  }
  printf("ASSERT FAILED, line %d: %s\n",0x136,
         "Template::FindTemplateFilename(\"template_foo\").empty()");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"template_foo",&local_741);
  ctemplate::Template::FindTemplateFilename(local_720,(string *)local_740);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    __assert_fail("Template::FindTemplateFilename(\"template_foo\").empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x136,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
  }
  std::__cxx11::string::~string((string *)local_720);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  exit(1);
}

Assistant:

static void TestTemplateSearchPath() {
    TemplateCache cache1;

    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);

    TemplateDictionary dict("");
    cache1.SetTemplateRootDirectory(pathA);
    cache1.AddAlternateTemplateRootDirectory(pathB);
    ASSERT(cache1.template_root_directory() == pathA);

    // 1. Show that a template in the secondary path can be found.
    const string path_b_bar = PathJoin(pathB, "template_bar");
    StringToFile("b/template_bar", path_b_bar);
    ASSERT_STREQ(path_b_bar.c_str(),
                 cache1.FindTemplateFilename("template_bar").c_str());
    const Template* b_bar = cache1.GetTemplate("template_bar", DO_NOT_STRIP);
    ASSERT(b_bar);
    AssertExpandIs(b_bar, &dict, "b/template_bar", true);

    // 2. Show that the search stops once the first match is found.
    //    Create two templates in separate directories with the same name.
    const string path_a_foo = PathJoin(pathA, "template_foo");
    const string path_b_foo = PathJoin(pathB, "template_foo");
    StringToFile("a/template_foo", path_a_foo);
    StringToFile("b/template_foo", path_b_foo);
    ASSERT_STREQ(path_a_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());
    const Template* a_foo = cache1.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(a_foo);
    AssertExpandIs(a_foo, &dict, "a/template_foo", true);

    // 3. Show that attempting to find a non-existent template gives an
    //    empty path.
    ASSERT(cache1.FindTemplateFilename("baz").empty());

    // 4. If we make a new cache, its path will be followed.
    TemplateCache cache2;
    cache2.SetTemplateRootDirectory(pathB);
    ASSERT_STREQ(path_b_foo.c_str(),
                 cache2.FindTemplateFilename("template_foo").c_str());
    const Template* b_foo = cache2.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(b_foo);
    AssertExpandIs(b_foo, &dict, "b/template_foo", true);

    // 5. Neither path will work for the default cache, which has no path.
    ASSERT(Template::template_root_directory() == kCWD);
    ASSERT(Template::FindTemplateFilename("template_foo").empty());
    ASSERT(!Template::GetTemplate("template_foo", DO_NOT_STRIP));

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }